

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate.cpp
# Opt level: O1

bool isEntryInIanaList(QByteArrayView id,QByteArrayView ianaIds)

{
  int iVar1;
  void *pvVar2;
  char *b;
  storage_type *__s;
  size_t __n;
  size_t __n_00;
  size_t sVar3;
  bool bVar4;
  
  __n = id.m_size;
  __s = ianaIds.m_data;
  __n_00 = ianaIds.m_size;
  do {
    if (((long)__n_00 < 1) || (pvVar2 = memchr(__s,0x20,__n_00), pvVar2 == (void *)0x0)) {
      sVar3 = 0xffffffffffffffff;
    }
    else {
      sVar3 = (long)pvVar2 - (long)__s;
    }
    if ((long)sVar3 < 0) {
      if (__n_00 == __n) {
        if (__n == 0) {
          bVar4 = true;
        }
        else {
          iVar1 = bcmp(id.m_data,__s,__n);
          bVar4 = iVar1 == 0;
        }
      }
      else {
        bVar4 = false;
      }
      return bVar4;
    }
    if (sVar3 == __n) {
      if (__n == 0) {
        return true;
      }
      iVar1 = bcmp(id.m_data,__s,__n);
      if (iVar1 == 0) {
        return true;
      }
    }
    __s = __s + sVar3 + 1;
    __n_00 = __n_00 - (sVar3 + 1);
  } while( true );
}

Assistant:

static bool isEntryInIanaList(QByteArrayView id, QByteArrayView ianaIds)
{
    qsizetype cut;
    while ((cut = ianaIds.indexOf(' ')) >= 0) {
        if (id == ianaIds.first(cut))
            return true;
        ianaIds = ianaIds.sliced(cut + 1);
    }
    return id == ianaIds;
}